

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

void rename_regs(MIR_context_t ctx,MIR_func_t func,MIR_func_t called_func,VARR_MIR_var_t *vars,
                size_t nvars)

{
  VARR_char *pVVar1;
  VARR_MIR_reg_t *pVVar2;
  MIR_reg_t reg;
  MIR_reg_t MVar3;
  size_t sVar4;
  char *pcVar5;
  char *name;
  MIR_reg_t *__ptr;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  MIR_func_t size;
  size_t ix;
  MIR_type_t type;
  MIR_var_t local_80;
  char buff [50];
  
  if (vars != (VARR_MIR_var_t *)0x0) {
    size = func;
    for (ix = 0; ix != nvars; ix = ix + 1) {
      VARR_chartrunc(ctx->temp_string,(size_t)size);
      sprintf(buff,".c%d_",(ulong)func->n_inlines);
      pVVar1 = ctx->temp_string;
      sVar4 = strlen(buff);
      VARR_charpush_arr(pVVar1,buff,sVar4);
      VARR_MIR_var_tget(&local_80,vars,ix);
      pcVar5 = local_80.name;
      type = MIR_T_I64;
      if ((local_80.type & ~MIR_T_U8) == MIR_T_F) {
        type = local_80.type;
      }
      if (local_80.type == MIR_T_LD) {
        type = local_80.type;
      }
      reg = MIR_reg(ctx,local_80.name,called_func);
      pVVar1 = ctx->temp_string;
      sVar4 = strlen(pcVar5);
      VARR_charpush_arr(pVVar1,pcVar5,sVar4 + 1);
      pcVar5 = MIR_reg_hard_reg_name(ctx,reg,called_func);
      name = VARR_charaddr(ctx->temp_string);
      if (pcVar5 == (char *)0x0) {
        size = func;
        MVar3 = MIR_new_func_reg(ctx,func,type,name);
      }
      else {
        size = func;
        MVar3 = new_func_reg(ctx,func,type,name,pcVar5);
      }
      while( true ) {
        pVVar2 = ctx->simplify_ctx->inline_reg_map;
        if (pVVar2 == (VARR_MIR_reg_t *)0x0) {
          pcVar5 = "length";
          goto LAB_00120ae9;
        }
        uVar6 = pVVar2->els_num;
        if (reg < uVar6) break;
        __ptr = pVVar2->varr;
        if (__ptr == (MIR_reg_t *)0x0) {
          pcVar5 = "expand";
          goto LAB_00120ae9;
        }
        uVar7 = uVar6 + 1;
        if (pVVar2->size <= uVar6) {
          sVar8 = (uVar7 >> 1) + uVar7;
          size = (MIR_func_t)(sVar8 * 4);
          __ptr = (MIR_reg_t *)realloc(__ptr,(size_t)size);
          pVVar2->varr = __ptr;
          pVVar2->size = sVar8;
          uVar6 = pVVar2->els_num;
          uVar7 = uVar6 + 1;
        }
        pVVar2->els_num = uVar7;
        __ptr[uVar6] = 0;
      }
      if (pVVar2->varr == (MIR_reg_t *)0x0) {
        pcVar5 = "set";
LAB_00120ae9:
        mir_varr_assert_fail(pcVar5,"MIR_reg_t");
      }
      pVVar2->varr[reg] = MVar3;
    }
  }
  return;
}

Assistant:

static void rename_regs (MIR_context_t ctx, MIR_func_t func, MIR_func_t called_func,
                         VARR (MIR_var_t) * vars, size_t nvars) {
  char buff[50];
  const char *hard_reg_name;
  MIR_var_t var;
  MIR_type_t type;
  MIR_reg_t old_reg, new_reg;

  if (vars == NULL) return;
  for (size_t i = 0; i < nvars; i++) {
    VARR_TRUNC (char, temp_string, 0);
    sprintf (buff, ".c%d_", func->n_inlines);
    VARR_PUSH_ARR (char, temp_string, buff, strlen (buff));
    var = VARR_GET (MIR_var_t, vars, i);
    type
      = (var.type == MIR_T_F || var.type == MIR_T_D || var.type == MIR_T_LD ? var.type : MIR_T_I64);
    old_reg = MIR_reg (ctx, var.name, called_func);
    VARR_PUSH_ARR (char, temp_string, var.name, strlen (var.name) + 1);
    if ((hard_reg_name = MIR_reg_hard_reg_name (ctx, old_reg, called_func)) != NULL) {
      new_reg
        = MIR_new_global_func_reg (ctx, func, type, VARR_ADDR (char, temp_string), hard_reg_name);
    } else {
      new_reg = MIR_new_func_reg (ctx, func, type, VARR_ADDR (char, temp_string));
    }
    set_inline_reg_map (ctx, old_reg, new_reg);
  }
}